

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::prune(Dictionary *this,vector<int,_std::allocator<int>_> *idx)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  const_iterator __last;
  int iVar1;
  bool bVar2;
  entry_type eVar3;
  reference piVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  ulong uVar8;
  reference pvVar9;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  *this_00;
  int32_t i;
  int32_t j;
  int ngram;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int32_t j_1;
  int32_t x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> ngrams;
  vector<int,_std::allocator<int>_> words;
  undefined4 in_stack_fffffffffffffe48;
  int32_t in_stack_fffffffffffffe4c;
  Dictionary *in_stack_fffffffffffffe50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int32_t in_stack_fffffffffffffe74;
  const_iterator in_stack_fffffffffffffe78;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe80;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  iterator in_stack_fffffffffffffeb0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  int local_ec;
  int local_e8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  vector<int,_std::allocator<int>_> *local_90;
  int local_84;
  int *local_80;
  int *local_78;
  int local_6c;
  int *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> local_40;
  vector<int,_std::allocator<int>_> local_28;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16089c);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1608a9);
  std::vector<int,_std::allocator<int>_>::size(local_10);
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78._M_current);
  std::vector<int,_std::allocator<int>_>::size(local_10);
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78._M_current);
  local_58 = local_10;
  local_60._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffe50,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (!bVar2) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_60);
    local_6c = *piVar4;
    if (local_6c < *(int *)(in_RDI + 0x5c)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58._M_current);
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58._M_current);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_60);
  }
  local_78 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_80 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  _Var10._M_current._4_4_ = in_stack_fffffffffffffe64;
  _Var10._M_current._0_4_ = in_stack_fffffffffffffe60;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (_Var10,in_stack_fffffffffffffe58);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_40);
  if (sVar5 != 0) {
    local_84 = 0;
    local_90 = &local_40;
    local_98._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffe50,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (!bVar2) break;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_98);
      iVar1 = local_84;
      pmVar6 = std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_fffffffffffffe50,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      *pmVar6 = iVar1;
      local_84 = local_84 + 1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_98);
    }
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffe50,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    _Var10._M_current = (int *)&local_40;
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    in_stack_fffffffffffffeb0 =
         std::vector<int,std::allocator<int>>::
         insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                   (in_stack_fffffffffffffe90,(const_iterator)local_10,_Var10,
                    in_stack_fffffffffffffe98);
  }
  sVar7 = std::
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::size((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)0x160be3);
  *(size_type *)(in_RDI + 0x70) = sVar7;
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  __first._M_current._4_4_ = in_stack_fffffffffffffe64;
  __first._M_current._0_4_ = in_stack_fffffffffffffe60;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (__first,in_stack_fffffffffffffe58,(int *)in_stack_fffffffffffffe50);
  local_e8 = 0;
  local_ec = 0;
  do {
    uVar8 = (ulong)local_ec;
    sVar5 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::size
                      ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28))
    ;
    if (sVar5 <= uVar8) {
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_28);
      *(int *)(in_RDI + 0x5c) = (int)sVar5;
      *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x5c) + *(int *)(in_RDI + 0x60);
      this_00 = (__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                 *)(in_RDI + 0x28);
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      __gnu_cxx::
      __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
      ::operator+((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                   *)in_stack_fffffffffffffe58._M_current,(difference_type)this_00);
      __gnu_cxx::
      __normal_iterator<fasttext::entry_const*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>
      ::__normal_iterator<fasttext::entry*>
                (this_00,(__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      __gnu_cxx::
      __normal_iterator<fasttext::entry_const*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>
      ::__normal_iterator<fasttext::entry*>
                (this_00,(__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      __last._M_current._4_4_ = in_stack_fffffffffffffe74;
      __last._M_current._0_4_ = in_stack_fffffffffffffe70;
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::erase
                (in_stack_fffffffffffffe68,in_stack_fffffffffffffe78,__last);
      initNgrams((Dictionary *)in_stack_fffffffffffffeb0._M_current);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      return;
    }
    eVar3 = getType(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    if (eVar3 == label) {
LAB_00160ced:
      in_stack_fffffffffffffe78._M_current = (entry *)(in_RDI + 0x28);
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                 in_stack_fffffffffffffe78._M_current,(long)local_ec);
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                 in_stack_fffffffffffffe78._M_current,(long)local_e8);
      entry::operator=((entry *)in_stack_fffffffffffffe50,
                       (entry *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      in_stack_fffffffffffffe68 =
           (vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x10);
      in_stack_fffffffffffffe64 = local_e8;
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28),
                 (long)local_e8);
      in_stack_fffffffffffffe74 =
           find((Dictionary *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                (string *)in_stack_fffffffffffffe58._M_current);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe68,
                          (long)in_stack_fffffffffffffe74);
      *pvVar9 = in_stack_fffffffffffffe64;
      local_e8 = local_e8 + 1;
    }
    else {
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_28);
      if ((ulong)(long)local_e8 < sVar5) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_e8);
        if (*pvVar9 == local_ec) goto LAB_00160ced;
      }
    }
    local_ec = local_ec + 1;
  } while( true );
}

Assistant:

void Dictionary::prune(std::vector<int32_t>& idx) {
  std::vector<int32_t> words, ngrams;
  words.reserve(idx.size());
  ngrams.reserve(idx.size());
  for (int32_t x : idx) {
    if (x < nwords_) {
      words.push_back(x);
    } else {
      ngrams.push_back(x);
    }
  }
  std::sort(words.begin(), words.end());
  idx = words;

  if (ngrams.size() != 0) {
    int32_t j = 0;
    for (const auto ngram : ngrams) {
      pruneidx_[ngram - nwords_] = j;
      j++;
    }
    idx.insert(idx.end(), ngrams.begin(), ngrams.end());
  }
  pruneidx_size_ = pruneidx_.size();

  std::fill(word2int_.begin(), word2int_.end(), -1);

  int32_t j = 0;
  for (int32_t i = 0; i < words_.size(); i++) {
    if (getType(i) == entry_type::label ||
        (j < words.size() && words[j] == i)) {
      words_[j] = words_[i];
      word2int_[find(words_[j].word)] = j;
      j++;
    }
  }
  nwords_ = words.size();
  size_ = nwords_ + nlabels_;
  words_.erase(words_.begin() + size_, words_.end());
  initNgrams();
}